

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O3

int If_ManCutAigDelay(If_Man_t *p,If_Obj_t *pObj,If_Cut_t *pCut)

{
  float fVar1;
  uint uVar2;
  uint *puVar3;
  int iVar4;
  void **ppvVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  
  pVVar7 = p->vVisited;
  pVVar7->nSize = 0;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    uVar8 = 0;
    do {
      fVar1 = (&pCut[1].Area)[uVar8];
      if (((long)(int)fVar1 < 0) || (p->vObjs->nSize <= (int)fVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar3 = (uint *)p->vObjs->pArray[(int)fVar1];
      if (puVar3 == (uint *)0x0) break;
      if ((*puVar3 >> 9 & 1) != 0) {
        __assert_fail("pLeaf->fVisit == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                      ,0x49,"int If_ManCutAigDelay(If_Man_t *, If_Obj_t *, If_Cut_t *)");
      }
      *puVar3 = *puVar3 | 0x200;
      pVVar7 = p->vVisited;
      uVar2 = pVVar7->nSize;
      if (uVar2 == pVVar7->nCap) {
        if ((int)uVar2 < 0x10) {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar7->pArray,0x80);
          }
          pVVar7->pArray = ppvVar5;
          pVVar7->nCap = 0x10;
        }
        else {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
          }
          pVVar7->pArray = ppvVar5;
          pVVar7->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar5 = pVVar7->pArray;
      }
      iVar4 = pVVar7->nSize;
      pVVar7->nSize = iVar4 + 1;
      ppvVar5[iVar4] = puVar3;
      puVar3[0x10] = (int)(float)puVar3[0x17];
      uVar8 = uVar8 + 1;
    } while (uVar8 < (byte)pCut->field_0x1f);
    pVVar7 = p->vVisited;
  }
  iVar4 = If_ManCutAigDelay_rec(p,pObj,pVVar7);
  pVVar7 = p->vVisited;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      *(uint *)pVVar7->pArray[lVar6] = *pVVar7->pArray[lVar6] & 0xfffffdff;
      lVar6 = lVar6 + 1;
      pVVar7 = p->vVisited;
    } while (lVar6 < pVVar7->nSize);
  }
  return iVar4;
}

Assistant:

int If_ManCutAigDelay( If_Man_t * p, If_Obj_t * pObj, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    int i, Delay;
    Vec_PtrClear( p->vVisited );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        assert( pLeaf->fVisit == 0 );
        pLeaf->fVisit = 1;
        Vec_PtrPush( p->vVisited, pLeaf );
        pLeaf->iCopy = If_ObjCutBest(pLeaf)->Delay;
    }
    Delay = If_ManCutAigDelay_rec( p, pObj, p->vVisited );
    Vec_PtrForEachEntry( If_Obj_t *, p->vVisited, pLeaf, i )
        pLeaf->fVisit = 0;
//    assert( Delay <= (int)pObj->Level );
    return Delay;
}